

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O1

void addFirstLineAllocation(AssemblyCommands *commands,RegisterInfo *registerInfo)

{
  const_iterator cVar1;
  pointer pcVar2;
  undefined1 local_71;
  MoveRegRegCommand *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_68;
  value_type local_60;
  int local_4c;
  value_type local_48;
  element_type local_38 [2];
  
  cVar1._M_current =
       (commands->
       super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (registerInfo->espReg).name._M_dataplus._M_p;
  local_48.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (registerInfo->espReg).name._M_string_length);
  local_4c = totalAllocated * 4;
  local_70 = (MoveRegRegCommand *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<AssemblyCode::SubRegConstCommand,std::allocator<AssemblyCode::SubRegConstCommand>,IRT::CTemp,int>
            (&_Stack_68,(SubRegConstCommand **)&local_70,
             (allocator<AssemblyCode::SubRegConstCommand> *)&local_71,(CTemp *)&local_48,&local_4c);
  local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_70->super_AssemblyCommand;
  local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_68._M_pi;
  local_70 = (MoveRegRegCommand *)0x0;
  _Stack_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::_M_insert_rval(commands,cVar1,&local_60);
  if (local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_68._M_pi);
  }
  if (local_48.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != local_38) {
    operator_delete(local_48.
                    super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  cVar1._M_current =
       (commands->
       super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<AssemblyCode::MoveRegRegCommand,std::allocator<AssemblyCode::MoveRegRegCommand>,IRT::CTemp&,IRT::CTemp&>
            (&local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(MoveRegRegCommand **)&local_60,
             (allocator<AssemblyCode::MoveRegRegCommand> *)&local_70,&registerInfo->spBeginReg,
             &registerInfo->espReg);
  local_48.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_48.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::_M_insert_rval(commands,cVar1,&local_48);
  if (local_48.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_60.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void addFirstLineAllocation(AssemblyCommands& commands, AssemblyCode::RegisterInfo& registerInfo) {
    commands.insert(commands.begin(),
                    std::make_shared<AssemblyCode::SubRegConstCommand>(IRT::CTemp(registerInfo.espReg),
                    totalAllocated * IRT::CFrame::wordSize));

    commands.insert(commands.begin(),
                    std::make_shared<AssemblyCode::MoveRegRegCommand>(registerInfo.spBeginReg,
                                                    registerInfo.espReg));
}